

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

qsizetype QtPrivate::indexOf<QTzTransitionRule,QTzTransitionRule>
                    (QList<QTzTransitionRule> *vector,QTzTransitionRule *u,qsizetype from)

{
  ulong uVar1;
  QTzTransitionRule *pQVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (vector->d).size;
  uVar3 = from;
  if (from < 0) {
    uVar3 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar3 = 0;
    }
  }
  if (uVar3 < uVar1) {
    pQVar2 = (vector->d).ptr;
    lVar4 = uVar3 * 0xc;
    do {
      if (((*(int *)((long)&pQVar2->stdOffset + lVar4) == u->stdOffset) &&
          (*(int *)((long)&pQVar2->dstOffset + lVar4) == u->dstOffset)) &&
         ((&pQVar2->abbreviationIndex)[lVar4] == u->abbreviationIndex)) {
        return (lVar4 >> 2) * -0x5555555555555555;
      }
      lVar4 = lVar4 + 0xc;
    } while (uVar1 * 0xc != lVar4);
  }
  return -1;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }